

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O0

uint32_t uprv_convertToLCID_63(char *langID,char *posixID,UErrorCode *status)

{
  uint32_t uVar1;
  size_t sVar2;
  uint local_4c;
  UErrorCode local_48;
  uint32_t idx;
  UErrorCode myStatus;
  uint32_t fallbackValue;
  uint32_t value;
  int32_t compVal;
  uint32_t oldmid;
  uint32_t mid;
  uint32_t high;
  uint32_t low;
  UErrorCode *status_local;
  char *posixID_local;
  char *langID_local;
  
  mid = 0;
  oldmid = 0x8d;
  value = 0;
  myStatus = U_ZERO_ERROR;
  idx = 0xffffffff;
  if ((((langID == (char *)0x0) || (posixID == (char *)0x0)) ||
      (_high = status, status_local = (UErrorCode *)posixID, posixID_local = langID,
      sVar2 = strlen(langID), sVar2 < 2)) || (sVar2 = strlen((char *)status_local), sVar2 < 2)) {
    langID_local._4_4_ = 0;
  }
  else {
    while ((mid < oldmid && (compVal = oldmid + mid >> 1, compVal != value))) {
      fallbackValue = strcmp(posixID_local,(gPosixIDmap[(uint)compVal].regionMaps)->posixID);
      if ((int)fallbackValue < 0) {
        oldmid = compVal;
      }
      else {
        if ((int)fallbackValue < 1) {
          uVar1 = getHostID(gPosixIDmap + (uint)compVal,(char *)status_local,_high);
          return uVar1;
        }
        mid = compVal;
      }
      value = compVal;
    }
    for (local_4c = 0; local_4c < 0x8d; local_4c = local_4c + 1) {
      local_48 = U_ZERO_ERROR;
      myStatus = getHostID(gPosixIDmap + local_4c,(char *)status_local,&local_48);
      if (local_48 == U_ZERO_ERROR) {
        return myStatus;
      }
      if (local_48 == U_ERROR_WARNING_START) {
        idx = myStatus;
      }
    }
    if (idx == 0xffffffff) {
      *_high = U_ILLEGAL_ARGUMENT_ERROR;
      langID_local._4_4_ = 0;
    }
    else {
      *_high = U_ERROR_WARNING_START;
      langID_local._4_4_ = idx;
    }
  }
  return langID_local._4_4_;
}

Assistant:

U_CAPI uint32_t
uprv_convertToLCID(const char *langID, const char* posixID, UErrorCode* status)
{
    // This function does the table lookup when native platform name->lcid conversion isn't available,
    // or for locales that don't follow patterns the platform expects.
    uint32_t   low    = 0;
    uint32_t   high   = gLocaleCount;
    uint32_t   mid;
    uint32_t   oldmid = 0;
    int32_t    compVal;

    uint32_t   value         = 0;
    uint32_t   fallbackValue = (uint32_t)-1;
    UErrorCode myStatus;
    uint32_t   idx;

    /* Check for incomplete id. */
    if (!langID || !posixID || uprv_strlen(langID) < 2 || uprv_strlen(posixID) < 2) {
        return 0;
    }

    /*Binary search for the map entry for normal cases */

    while (high > low)  /*binary search*/{

        mid = (high+low) >> 1; /*Finds median*/

        if (mid == oldmid) 
            break;

        compVal = uprv_strcmp(langID, gPosixIDmap[mid].regionMaps->posixID);
        if (compVal < 0){
            high = mid;
        }
        else if (compVal > 0){
            low = mid;
        }
        else /*we found it*/{
            return getHostID(&gPosixIDmap[mid], posixID, status);
        }
        oldmid = mid;
    }

    /*
     * Sometimes we can't do a binary search on posixID because some LCIDs
     * go to different locales.  We hit one of those special cases.
     */
    for (idx = 0; idx < gLocaleCount; idx++ ) {
        myStatus = U_ZERO_ERROR;
        value = getHostID(&gPosixIDmap[idx], posixID, &myStatus);
        if (myStatus == U_ZERO_ERROR) {
            return value;
        }
        else if (myStatus == U_USING_FALLBACK_WARNING) {
            fallbackValue = value;
        }
    }

    if (fallbackValue != (uint32_t)-1) {
        *status = U_USING_FALLBACK_WARNING;
        return fallbackValue;
    }

    /* no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;   /* return international (root) */
}